

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O0

int do_dirname(GENERAL_NAME *gen,char *value,X509V3_CTX *ctx)

{
  int iVar1;
  stack_st_CONF_VALUE *dn_sk;
  X509_NAME *nm_00;
  X509_NAME *nm;
  stack_st_CONF_VALUE *sk;
  int ret;
  X509V3_CTX *ctx_local;
  char *value_local;
  GENERAL_NAME *gen_local;
  
  sk._4_4_ = 0;
  dn_sk = X509V3_get_section((X509V3_CTX *)ctx,value);
  nm_00 = X509_NAME_new();
  if (nm_00 != (X509_NAME *)0x0) {
    if (dn_sk == (stack_st_CONF_VALUE *)0x0) {
      ERR_put_error(0x14,0,0x99,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                    ,0x240);
      ERR_add_error_data(2,"section=",value);
    }
    else {
      iVar1 = X509V3_NAME_from_section(nm_00,dn_sk,0x1001);
      if (iVar1 != 0) {
        gen->type = 4;
        (gen->d).otherName = (OTHERNAME *)nm_00;
        sk._4_4_ = 1;
      }
    }
  }
  if (sk._4_4_ == 0) {
    X509_NAME_free(nm_00);
  }
  return sk._4_4_;
}

Assistant:

static int do_dirname(GENERAL_NAME *gen, const char *value,
                      const X509V3_CTX *ctx) {
  int ret = 0;
  const STACK_OF(CONF_VALUE) *sk = X509V3_get_section(ctx, value);
  X509_NAME *nm = X509_NAME_new();
  if (nm == NULL) {
    goto err;
  }
  if (sk == NULL) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_SECTION_NOT_FOUND);
    ERR_add_error_data(2, "section=", value);
    goto err;
  }
  // FIXME: should allow other character types...
  if (!X509V3_NAME_from_section(nm, sk, MBSTRING_ASC)) {
    goto err;
  }
  gen->type = GEN_DIRNAME;
  gen->d.dirn = nm;
  ret = 1;

err:
  if (!ret) {
    X509_NAME_free(nm);
  }
  return ret;
}